

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void __thiscall CConsole::CConsole(CConsole *this,int FlagMask)

{
  (this->super_IConsole).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IConsole).super_IInterface._vptr_IInterface = (_func_int **)&PTR__CConsole_002135f8;
  CHeap::CHeap(&this->m_TempCommands);
  CHeap::CHeap(&(this->m_ExecutionQueue).m_Queue);
  this->m_FlagMask = FlagMask;
  this->m_AccessLevel = 0;
  this->m_pRecycleList = (CCommand *)0x0;
  CHeap::Reset(&this->m_TempCommands);
  this->m_StoreCommands = true;
  this->m_paStrokeStr[0] = "0";
  this->m_paStrokeStr[1] = "1";
  this->m_pTempMapListHeap = (CHeap *)0x0;
  this->m_pFirstMapEntry = (CMapListEntryTemp *)0x0;
  this->m_pLastMapEntry = (CMapListEntryTemp *)0x0;
  CHeap::Reset(&(this->m_ExecutionQueue).m_Queue);
  (this->m_ExecutionQueue).m_pFirst = (CQueueEntry *)0x0;
  (this->m_ExecutionQueue).m_pLast = (CQueueEntry *)0x0;
  this->m_pFirstCommand = (CCommand *)0x0;
  this->m_pFirstExec = (CExecFile *)0x0;
  mem_zero(this->m_aPrintCB,0x60);
  this->m_NumPrintCB = 0;
  this->m_pConfig = (CConfig *)0x0;
  this->m_pStorage = (IStorage *)0x0;
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"echo","r[text]",6,Con_Echo,this,"Echo the text");
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"exec","r[file]",6,Con_Exec,this,"Execute the specified file");
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"eval_if","s[config] s[comparison] s[value] s[command] ?s[else] ?s[command]",0xe,
             Con_EvalIf,this,"Execute command if condition is true");
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"toggle","s[config-option] i[value1] i[value2]",6,ConToggle,this,
             "Toggle config value");
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"+toggle","s[config-option] i[value1] i[value2]",2,ConToggleStroke,this,
             "Toggle config value via keypress");
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"mod_command","s[command] ?i[access-level]",4,ConModCommandAccess,this,
             "Specify command accessibility for moderators");
  (*(this->super_IConsole).super_IInterface._vptr_IInterface[8])
            (this,"mod_status","",4,ConModCommandStatus,this,
             "List all commands which are accessible for moderators");
  return;
}

Assistant:

CConsole::CConsole(int FlagMask)
{
	m_FlagMask = FlagMask;
	m_AccessLevel = ACCESS_LEVEL_ADMIN;
	m_pRecycleList = 0;
	m_TempCommands.Reset();
	m_StoreCommands = true;
	m_paStrokeStr[0] = "0";
	m_paStrokeStr[1] = "1";
	m_pTempMapListHeap = 0;
	m_pFirstMapEntry = 0;
	m_pLastMapEntry = 0;
	m_ExecutionQueue.Reset();
	m_pFirstCommand = 0;
	m_pFirstExec = 0;
	mem_zero(m_aPrintCB, sizeof(m_aPrintCB));
	m_NumPrintCB = 0;

	m_pConfig = 0;
	m_pStorage = 0;

	// register some basic commands
	Register("echo", "r[text]", CFGFLAG_SERVER|CFGFLAG_CLIENT, Con_Echo, this, "Echo the text");
	Register("exec", "r[file]", CFGFLAG_SERVER|CFGFLAG_CLIENT, Con_Exec, this, "Execute the specified file");
	Register("eval_if", "s[config] s[comparison] s[value] s[command] ?s[else] ?s[command]", CFGFLAG_SERVER|CFGFLAG_CLIENT|CFGFLAG_STORE, Con_EvalIf, this, "Execute command if condition is true");

	Register("toggle", "s[config-option] i[value1] i[value2]", CFGFLAG_SERVER|CFGFLAG_CLIENT, ConToggle, this, "Toggle config value");
	Register("+toggle", "s[config-option] i[value1] i[value2]", CFGFLAG_CLIENT, ConToggleStroke, this, "Toggle config value via keypress");

	Register("mod_command", "s[command] ?i[access-level]", CFGFLAG_SERVER, ConModCommandAccess, this, "Specify command accessibility for moderators");
	Register("mod_status", "", CFGFLAG_SERVER, ConModCommandStatus, this, "List all commands which are accessible for moderators");
}